

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorCubes.c
# Opt level: O0

int AllocateCover(int nCubes,int nWordsIn,int nWordsOut)

{
  int iVar1;
  int iVar2;
  Cube **ppCVar3;
  Cube *pCVar4;
  int local_34;
  int local_30;
  int k;
  int i;
  int TotalSize;
  Cube **pp;
  int OneInputSetSize;
  int OneCubeSize;
  int nWordsOut_local;
  int nWordsIn_local;
  int nCubes_local;
  
  iVar1 = (nWordsIn + nWordsOut) * 4 + 0x28;
  ppCVar3 = (Cube **)malloc((long)nCubes << 3);
  if (ppCVar3 == (Cube **)0x0) {
    nWordsIn_local = 0;
  }
  else {
    iVar2 = nCubes * iVar1;
    pCVar4 = (Cube *)malloc((long)iVar2);
    *ppCVar3 = pCVar4;
    if (*ppCVar3 == (Cube *)0x0) {
      nWordsIn_local = 0;
    }
    else {
      memset(*ppCVar3,0,(long)iVar2);
      (*ppCVar3)->pCubeDataIn = (drow *)(*ppCVar3 + 1);
      (*ppCVar3)->pCubeDataOut = (drow *)((long)(*ppCVar3)->pCubeDataIn + (long)(nWordsIn << 2));
      for (local_30 = 1; local_30 < nCubes; local_30 = local_30 + 1) {
        ppCVar3[local_30] = (Cube *)(&ppCVar3[local_30 + -1]->fMark + iVar1);
        ppCVar3[local_30]->pCubeDataIn = (drow *)(ppCVar3[local_30] + 1);
        ppCVar3[local_30]->pCubeDataOut =
             (drow *)((long)ppCVar3[local_30]->pCubeDataIn + (long)(nWordsIn << 2));
      }
      for (local_34 = 0; local_34 < nCubes + -1; local_34 = local_34 + 1) {
        ppCVar3[local_34]->Next = ppCVar3[local_34 + 1];
      }
      s_CubesFree = *ppCVar3;
      g_CoverInfo.nCubesInUse = 0;
      g_CoverInfo.nCubesFree = nCubes;
      s_pCoverMemory = ppCVar3;
      if (nCubes != g_CoverInfo.nCubesAlloc) {
        __assert_fail("g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/exor/exorCubes.c"
                      ,0x8e,"int AllocateCover(int, int, int)");
      }
      nWordsIn_local = nCubes * 8 + iVar2;
    }
  }
  return nWordsIn_local;
}

Assistant:

int AllocateCover( int nCubes, int nWordsIn, int nWordsOut )
// uses the cover parameters nCubes and nWords
// to allocate-and-clean the cover in one large piece
{
    int OneCubeSize;
    int OneInputSetSize;
    Cube ** pp;
    int TotalSize;
    int i, k;

    // determine the size of one cube WITH storage for bits
    OneCubeSize = sizeof(Cube) + (nWordsIn+nWordsOut)*sizeof(unsigned);
    // determine what is the amount of storage for the input part of the cube 
    OneInputSetSize = nWordsIn*sizeof(unsigned);

    // allocate memory for the array of pointers
    pp = (Cube **)ABC_ALLOC( Cube *, nCubes );
    if ( pp == NULL )
        return 0;

    // determine the size of the total cube cover
    TotalSize = nCubes*OneCubeSize;
    // allocate and clear memory for the cover in one large piece
    pp[0] = (Cube *)ABC_ALLOC( char, TotalSize );
    if ( pp[0] == NULL )
        return 0;
    memset( pp[0], 0, (size_t)TotalSize );

    // assign pointers to cubes and bit strings inside this piece
    pp[0]->pCubeDataIn  = (unsigned*)(pp[0] + 1);
    pp[0]->pCubeDataOut = (unsigned*)((char*)pp[0]->pCubeDataIn + OneInputSetSize);
    for ( i = 1; i < nCubes; i++ )
    {
        pp[i] = (Cube *)((char*)pp[i-1] + OneCubeSize);
        pp[i]->pCubeDataIn = (unsigned*)(pp[i] + 1);
        pp[i]->pCubeDataOut = (unsigned*)((char*)pp[i]->pCubeDataIn + OneInputSetSize);
    }

    // connect the cubes into the list using Next pointers
    for ( k = 0; k < nCubes-1; k++ )
        pp[k]->Next = pp[k+1];
    // the last pointer is already set to NULL

    // assign the head of the free list
    s_CubesFree = pp[0];
    // set the counters of the used and free cubes
    g_CoverInfo.nCubesInUse = 0;
    g_CoverInfo.nCubesFree = nCubes;

    // save the pointer to the allocated memory
    s_pCoverMemory = pp;

    assert ( g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc );

    return nCubes*sizeof(Cube *) + TotalSize;
}